

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::AddEnvOpndForInnerFrameDisplay(IRBuilder *this,Instr *instr,uint offset)

{
  Func *func;
  RegSlot srcRegSlot;
  RegSlot RVar1;
  JITTimeFunctionBody *this_00;
  RegOpnd *dstOpnd;
  SymOpnd *src1Opnd;
  Instr *instr_00;
  
  srcRegSlot = GetEnvRegForInnerFrameDisplay(this);
  if (srcRegSlot != 0xffffffff) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
    if (((srcRegSlot == RVar1) && (func = this->m_func, func->stackClosure == true)) &&
       (func->parentFunc == (Func *)0x0)) {
      dstOpnd = IR::RegOpnd::New(TyVar,func);
      src1Opnd = BuildFieldOpnd(this,LdSlot,(this->m_func->m_localFrameDisplaySym->super_Sym).m_id,0
                                ,0xffffffff,PropertyKindSlots,0xffffffff);
      instr_00 = IR::Instr::New(LdSlot,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      AddInstr(this,instr_00,offset);
    }
    else {
      dstOpnd = BuildSrcOpnd(this,srcRegSlot,TyVar);
    }
    IR::Instr::SetSrc2(instr,&dstOpnd->super_Opnd);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::AddEnvOpndForInnerFrameDisplay(IR::Instr *instr, uint offset)
{
    Js::RegSlot envReg = this->GetEnvRegForInnerFrameDisplay();
    if (envReg != Js::Constants::NoRegister)
    {
        IR::RegOpnd *src2Opnd;
        if (envReg == m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg() &&
            m_func->DoStackFrameDisplay() &&
            m_func->IsTopFunc())
        {
            src2Opnd = IR::RegOpnd::New(TyVar, m_func);
            this->AddInstr(
                IR::Instr::New(
                    Js::OpCode::LdSlot, src2Opnd,
                    this->BuildFieldOpnd(Js::OpCode::LdSlot, m_func->GetLocalFrameDisplaySym()->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlots),
                    m_func),
                offset);
        }
        else
        {
            src2Opnd = this->BuildSrcOpnd(envReg);
        }
        instr->SetSrc2(src2Opnd);
    }
}